

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int arenas_narenas_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                      size_t newlen)

{
  int iVar1;
  
  malloc_mutex_lock((tsdn_t *)tsd,&ctl_mtx);
  if (newp == (void *)0x0 && newlen == 0) {
    if (*oldlenp == 4) {
      iVar1 = 0;
      if (oldp != (void *)0x0) {
        *(uint *)oldp = ctl_arenas->narenas;
        iVar1 = 0;
      }
    }
    else {
      iVar1 = 0x16;
    }
  }
  else {
    iVar1 = 1;
  }
  ctl_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&ctl_mtx.field_0 + 0x40));
  return iVar1;
}

Assistant:

static int
arenas_narenas_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned narenas;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	READONLY();
	if (*oldlenp != sizeof(unsigned)) {
		ret = EINVAL;
		goto label_return;
	}
	narenas = ctl_arenas->narenas;
	READ(narenas, unsigned);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}